

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O1

void de::anon_unknown_0::singleThreadRemoveTest(WaitMode mode)

{
  SpinBarrier barrier;
  SpinBarrier local_2c;
  
  local_2c.m_numCores = deGetNumAvailableLogicalCores();
  local_2c.m_numThreads = 3;
  local_2c.m_numEntered = 0;
  local_2c.m_numLeaving = 0;
  local_2c.m_numRemoved = 0;
  SpinBarrier::removeThread(&local_2c,mode);
  SpinBarrier::removeThread(&local_2c,mode);
  SpinBarrier::sync(&local_2c);
  SpinBarrier::removeThread(&local_2c,mode);
  local_2c.m_numThreads = 1;
  local_2c.m_numEntered = 0;
  local_2c.m_numLeaving = 0;
  local_2c.m_numRemoved = 0;
  SpinBarrier::sync(&local_2c);
  local_2c.m_numThreads = 2;
  local_2c.m_numEntered = 0;
  local_2c.m_numLeaving = 0;
  local_2c.m_numRemoved = 0;
  SpinBarrier::removeThread(&local_2c,mode);
  SpinBarrier::sync(&local_2c);
  return;
}

Assistant:

void singleThreadRemoveTest (SpinBarrier::WaitMode mode)
{
	SpinBarrier barrier(3);

	barrier.removeThread(mode);
	barrier.removeThread(mode);
	barrier.sync(mode);
	barrier.removeThread(mode);

	barrier.reset(1);
	barrier.sync(mode);

	barrier.reset(2);
	barrier.removeThread(mode);
	barrier.sync(mode);
}